

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_acc::build_graph(test_acc *this,ggml_context *ctx)

{
  long lVar1;
  long lVar2;
  ggml_tensor *pgVar3;
  
  lVar1 = ggml_new_tensor(ctx,this->type,4,&this->ne_a);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,lVar1);
  ggml_set_name(lVar1,"a");
  lVar2 = ggml_new_tensor(ctx,this->type,4,&this->ne_b);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,lVar2);
  ggml_set_name(lVar2,"b");
  pgVar3 = (ggml_tensor *)
           ggml_acc(ctx,lVar1,lVar2,*(undefined8 *)(lVar1 + 0x38),*(undefined8 *)(lVar1 + 0x40),
                    *(undefined8 *)(lVar1 + 0x48),*(undefined8 *)(lVar2 + 0x38));
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne_a.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * b = ggml_new_tensor(ctx, type, 4, ne_b.data());
        ggml_set_param(ctx, b);
        ggml_set_name(b, "b");

        ggml_tensor * out = ggml_acc(ctx, a, b, a->nb[1], a->nb[2], a->nb[3], b->nb[1]);
        ggml_set_name(out, "out");

        return out;
    }